

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PSound::WriteValue(PSound *this,FSerializer *ar,char *key,void *addr)

{
  char *local_30;
  char *cptr;
  void *addr_local;
  char *key_local;
  FSerializer *ar_local;
  PSound *this_local;
  
  cptr = (char *)addr;
  addr_local = key;
  key_local = (char *)ar;
  ar_local = (FSerializer *)this;
  local_30 = FSoundID::operator_cast_to_char_((FSoundID *)addr);
  FSerializer::StringPtr((FSerializer *)key_local,(char *)addr_local,&local_30);
  return;
}

Assistant:

void PSound::WriteValue(FSerializer &ar, const char *key,const void *addr) const
{
	const char *cptr = *(const FSoundID *)addr;
	ar.StringPtr(key, cptr);
}